

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O1

void __thiscall sznet::net::TcpClient::~TcpClient(TcpClient *this)

{
  MutexLock *mutex;
  _Tuple_impl<0ul,std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>>
  *this_00;
  ulong __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventLoop *pEVar2;
  element_type *peVar3;
  _Manager_type p_Var4;
  pointer pcVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined8 unaff_R13;
  int iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __r;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1078 [32];
  undefined1 local_1058 [16];
  char local_1048 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1040;
  char *local_c8 [4];
  undefined1 auStack_a8 [8];
  CloseCallback cb;
  _Any_data local_68;
  code *pcStack_58;
  code *pcStack_50;
  undefined1 auStack_48 [8];
  TcpConnectionPtr conn;
  
  if (g_logLevel < 3) {
    file._8_8_ = 0xd;
    file.m_data = "TcpClient.cpp";
    Logger::Logger((Logger *)local_1078,file,0x3d);
    iVar9 = (int)local_c8;
    if (0x16 < (uint)(iVar9 - (int)local_c8[0])) {
      builtin_strncpy(local_c8[0],"TcpClient::~TcpClient[",0x16);
      local_c8[0] = local_c8[0] + 0x16;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(iVar9 - (int)local_c8[0])) {
      memcpy(local_c8[0],(this->m_name)._M_dataplus._M_p,__n);
      local_c8[0] = local_c8[0] + __n;
    }
    if (0xe < (uint)(iVar9 - (int)local_c8[0])) {
      builtin_strncpy(local_c8[0],"] - connector ",0xe);
      local_c8[0] = local_c8[0] + 0xe;
    }
    LogStream::operator<<
              ((LogStream *)(local_1078 + 8),
               (this->m_connector).
               super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger((Logger *)local_1078);
  }
  auStack_48 = (undefined1  [8])0x0;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  mutex = &this->m_mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  __r._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              &(this->m_connection).
               super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  p_Var1 = (this->m_connection).
           super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),p_Var1->_M_use_count == 1);
  }
  auStack_48 = (undefined1  [8])
               (this->m_connection).
               super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)__r._M_pi);
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  if (auStack_48 == (undefined1  [8])0x0) {
    conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = __r._M_pi;
    if (g_logLevel < 3) {
      file_00._8_8_ = 0xd;
      file_00.m_data = "TcpClient.cpp";
      Logger::Logger((Logger *)local_1078,file_00,0x58);
      if (0x17 < (uint)((int)local_c8 - (int)local_c8[0])) {
        builtin_strncpy(local_c8[0],"m_connection release!!!",0x17);
        local_c8[0] = local_c8[0] + 0x17;
      }
      Logger::~Logger((Logger *)local_1078);
    }
    Connector::stop((this->m_connector).
                    super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pEVar2 = this->m_loop;
    peVar3 = (this->m_connector).
             super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (this->m_connector).
             super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    pcStack_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = operator_new(0x18);
    *(code **)local_68._M_unused._0_8_ = detail::removeConnector;
    *(element_type **)((long)local_68._M_unused._0_8_ + 8) = peVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 0x10) =
         p_Var1;
    pcStack_50 = std::
                 _Function_handler<void_(),_std::_Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>_>
                 ::_M_invoke;
    pcStack_58 = std::
                 _Function_handler<void_(),_std::_Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>_>
                 ::_M_manager;
    EventLoop::runAfter(pEVar2,1.0,(TimerCallback *)&local_68);
    __r = conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    if (pcStack_58 != (code *)0x0) {
      (*pcStack_58)(&local_68,&local_68,__destroy_functor);
    }
  }
  else {
    conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._0_4_ = uVar8;
    pEVar2 = this->m_loop;
    if (pEVar2 != *(EventLoop **)((long)auStack_48 + 0x10)) {
      __assert_fail("m_loop == conn->getLoop()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                    ,0x4a,"sznet::net::TcpClient::~TcpClient()");
    }
    auStack_a8 = (undefined1  [8])0x0;
    cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    cb.super__Function_base._M_functor._8_8_ = 0;
    cb.super__Function_base._M_manager = (_Manager_type)0x0;
    auStack_a8 = (undefined1  [8])operator_new(0x10);
    *(code **)auStack_a8 = detail::removeConnection;
    *(EventLoop **)((long)auStack_a8 + 8) = pEVar2;
    cb.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_std::_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
         ::_M_invoke;
    cb.super__Function_base._M_functor._8_8_ =
         std::
         _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_std::_Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
         ::_M_manager;
    this_00 = (_Tuple_impl<0ul,std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>>
               *)(local_1078 + 0x10);
    local_1078._0_8_ = TcpConnection::setCloseCallback;
    local_1078._8_8_ = 0;
    std::
    _Tuple_impl<0ul,std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>>
    ::
    _Tuple_impl<std::shared_ptr<sznet::net::TcpConnection>&,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&,void>
              (this_00,(shared_ptr<sznet::net::TcpConnection> *)auStack_48,
               (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)auStack_a8);
    cb._M_invoker = (_Invoker_type)0x0;
    cb._M_invoker = (_Invoker_type)operator_new(0x40);
    p_Var1 = local_1040;
    *(undefined8 *)cb._M_invoker = local_1078._0_8_;
    *(undefined8 *)(cb._M_invoker + 8) = local_1078._8_8_;
    *(undefined1 (*) [16])(cb._M_invoker + 0x10) = ZEXT816(0) << 0x20;
    *(undefined8 *)(cb._M_invoker + 0x20) = 0;
    *(undefined8 *)(cb._M_invoker + 0x28) = local_1058._8_8_;
    auVar7 = local_1058;
    if (local_1058._0_8_ != 0) {
      *(undefined8 *)(cb._M_invoker + 0x10) = local_1078._16_8_;
      *(undefined8 *)(cb._M_invoker + 0x18) = local_1078._24_8_;
      *(undefined8 *)(cb._M_invoker + 0x20) = local_1058._0_8_;
      auVar7 = ZEXT816(0) << 0x20;
    }
    local_1058 = auVar7;
    *(char (*) [8])(cb._M_invoker + 0x30) = local_1048;
    *(undefined8 *)(cb._M_invoker + 0x38) = 0;
    local_1040 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(cb._M_invoker + 0x38) = p_Var1;
    local_1048[0] = '\0';
    local_1048[1] = '\0';
    local_1048[2] = '\0';
    local_1048[3] = '\0';
    local_1048[4] = '\0';
    local_1048[5] = '\0';
    local_1048[6] = '\0';
    local_1048[7] = '\0';
    EventLoop::runInLoop(pEVar2,(Functor *)&cb._M_invoker);
    std::
    _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_&)>_>
    ::_M_manager((_Any_data *)&cb._M_invoker,(_Any_data *)&cb._M_invoker,__destroy_functor);
    _Var6 = conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    if (local_1040 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1040);
    }
    if ((code *)local_1058._0_8_ != (code *)0x0) {
      (*(code *)local_1058._0_8_)(this_00,this_00,3);
    }
    if ((char)_Var6._M_pi != '\0') {
      TcpConnection::forceClose((TcpConnection *)auStack_48);
    }
    if (cb.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)cb.super__Function_base._M_functor._8_8_)(auStack_a8,auStack_a8,3);
    }
  }
  if (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(__r._M_pi)->_vptr__Sp_counted_base !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(__r._M_pi)->_vptr__Sp_counted_base);
  }
  MutexLock::~MutexLock(mutex);
  p_Var4 = (this->m_writeCompleteCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_writeCompleteCallback,
              (_Any_data *)&this->m_writeCompleteCallback,__destroy_functor);
  }
  p_Var4 = (this->m_messageCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_messageCallback,(_Any_data *)&this->m_messageCallback,
              __destroy_functor);
  }
  p_Var4 = (this->m_connectionCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_connectionCallback,(_Any_data *)&this->m_connectionCallback,
              __destroy_functor);
  }
  pcVar5 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(this->m_name).field_2) {
    operator_delete(pcVar5);
  }
  p_Var1 = (this->m_connector).super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

TcpClient::~TcpClient()
{
	LOG_INFO << "TcpClient::~TcpClient[" << m_name 
		<< "] - connector " << get_pointer(m_connector);
	TcpConnectionPtr conn;
	// TCP�����Ƿ���TcpClient(owner)���Գ���
	bool unique = false;
	{
		MutexLockGuard lock(m_mutex);
		unique = m_connection.use_count() == 1;
		// TcpClient������Ҫ�����ˣ��ڲ���Ҫ������
		conn = m_connection;
	}
	if (conn)
	{
		assert(m_loop == conn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		CloseCallback cb = std::bind(&detail::removeConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&TcpConnection::setCloseCallback, conn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (unique)
		{
			conn->forceClose();
		}
	}
	// tcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_connection release!!!";
		m_connector->stop();
		// FIXME: HACK
		m_loop->runAfter(1, std::bind(&detail::removeConnector, m_connector));
	}
}